

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnt_st_seg.c
# Opt level: O3

uint32 * cnt_st_seg(model_def_t *mdef,lexicon_t *lex)

{
  acmod_set_t *acmod_set;
  model_def_t *pmVar1;
  uint32 n_frame_00;
  uint32 n_phone_00;
  acmod_id_t *phone_00;
  uint16 *seg_00;
  model_def_t *pmVar2;
  uint uVar3;
  int iVar4;
  uint32 *puVar5;
  char *utt_name;
  uint32 *ptr;
  ulong uVar6;
  int32 n_frame;
  uint32 n_phone;
  acmod_id_t *phone;
  uint16 *seg;
  char *trans;
  uint32 local_64;
  uint local_60;
  uint32 local_5c;
  acmod_id_t *local_58;
  uint16 *local_50;
  char *local_48;
  model_def_t *local_40;
  lexicon_t *local_38;
  
  local_38 = lex;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/cnt_st_seg.c"
          ,0x62,"Counting # occ. for %u tied states\n",(ulong)mdef->n_tied_state);
  puVar5 = (uint32 *)
           __ckd_calloc__((ulong)mdef->n_tied_state,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/cnt_st_seg.c"
                          ,100);
  uVar3 = corpus_get_begin();
  iVar4 = corpus_next_utt();
  pmVar2 = mdef;
  pmVar1 = local_40;
  while (local_40 = pmVar2, iVar4 != 0) {
    if ((uVar3 * 0x26e978d5 >> 1 | (uint)((uVar3 * 0x26e978d5 & 1) != 0) << 0x1f) < 0x10624de) {
      err_msg(ERR_INFOCONT,(char *)0x0,0," cnt[%u]",(ulong)uVar3);
    }
    local_60 = uVar3;
    corpus_get_sent(&local_48);
    corpus_get_seg(&local_50,(int32 *)&local_64);
    mk_phone_seq(&local_58,&local_5c,local_48,mdef->acmod_set,local_38);
    seg_00 = local_50;
    phone_00 = local_58;
    n_phone_00 = local_5c;
    n_frame_00 = local_64;
    acmod_set = mdef->acmod_set;
    utt_name = corpus_utt();
    mdef = local_40;
    ck_seg(acmod_set,phone_00,n_phone_00,seg_00,n_frame_00,utt_name);
    ptr = mk_sseq(local_50,local_64,local_58,local_5c,mdef);
    ckd_free(local_58);
    ckd_free(local_50);
    ckd_free(local_48);
    if (ptr == (uint32 *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/cnt_st_seg.c"
              ,0x6f,"senone sequence not produced; skipping.\n");
    }
    else {
      if ((ulong)local_64 != 0) {
        uVar6 = 0;
        do {
          puVar5[ptr[uVar6]] = puVar5[ptr[uVar6]] + 1;
          uVar6 = uVar6 + 1;
        } while (local_64 != uVar6);
      }
      ckd_free(ptr);
    }
    uVar3 = local_60 + 1;
    iVar4 = corpus_next_utt();
    pmVar2 = local_40;
    pmVar1 = local_40;
  }
  if (mdef->n_tied_state != 0) {
    uVar6 = 0;
    local_40 = pmVar1;
    do {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/cnt_st_seg.c"
              ,0x7c,"ts= %u cnt= %u\n",uVar6 & 0xffffffff,(ulong)puVar5[uVar6]);
      uVar6 = uVar6 + 1;
    } while (uVar6 < mdef->n_tied_state);
  }
  return puVar5;
}

Assistant:

uint32 *
cnt_st_seg(model_def_t *mdef,
	   lexicon_t *lex)
{
    uint32 seq_no;
    uint32 n_frame;
    uint32 *sseq;
    uint32 *n_frame_per;
    uint32 i;

    E_INFO("Counting # occ. for %u tied states\n", mdef->n_tied_state);

    n_frame_per = ckd_calloc(mdef->n_tied_state, sizeof(uint32));

    for (seq_no = corpus_get_begin(); corpus_next_utt(); seq_no++) {
	if (!(seq_no % 250)) {
	    E_INFOCONT(" cnt[%u]", seq_no);
	}
	
	/* Read transcript and convert it into a senone sequence */
	sseq = get_next_sseq(mdef, lex, &n_frame);

	if (sseq == NULL) {
	    E_WARN("senone sequence not produced; skipping.\n");

	    continue;
	}

	for (i = 0; i < n_frame; i++) {
	    n_frame_per[sseq[i]]++;
	}

	ckd_free(sseq);
    }

    for (i = 0; i < mdef->n_tied_state; i++) {
	E_INFO("ts= %u cnt= %u\n", i, n_frame_per[i]);
    }

    return n_frame_per;
}